

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

SecretMatch __thiscall
duckdb::CatalogSetSecretStorage::LookupSecret
          (CatalogSetSecretStorage *this,string *path,string *type,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  CatalogTransaction transaction_00;
  pointer this_00;
  int64_t extraout_RDX;
  optional_ptr<duckdb::CatalogTransaction,_true> in_R8;
  SecretMatch SVar1;
  SecretMatch best_match;
  function<void_(duckdb::CatalogEntry_&)> callback;
  CatalogTransaction local_58;
  
  best_match.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
       0x0;
  best_match.score = -0x8000000000000000;
  callback.super__Function_base._M_manager = (_Manager_type)0x0;
  callback._M_invoker = (_Invoker_type)0x0;
  callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  callback.super__Function_base._M_functor._8_8_ = 0;
  callback.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(CatalogTransaction **)callback.super__Function_base._M_functor._M_unused._0_8_ = transaction.ptr
  ;
  *(SecretMatch **)((long)callback.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       &best_match;
  *(string **)((long)callback.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = type;
  *(string **)((long)callback.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = path;
  callback._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:106:55)>
       ::_M_invoke;
  callback.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:106:55)>
       ::_M_manager;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                        *)((long)&path[1].field_2 + 8));
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)path,in_R8);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  CatalogSet::Scan(this_00,transaction_00,&callback);
  if (best_match.secret_entry.
      super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
      super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
      0x0) {
    (this->super_SecretStorage)._vptr_SecretStorage = (_func_int **)0x0;
    (this->super_SecretStorage).storage_name._M_dataplus._M_p = (pointer)0x8000000000000000;
  }
  else {
    SecretMatch::SecretMatch((SecretMatch *)this,&best_match);
  }
  ::std::_Function_base::~_Function_base(&callback.super__Function_base);
  ::std::unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>::~unique_ptr
            ((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_> *)
             &best_match);
  SVar1.score = extraout_RDX;
  SVar1.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
  return SVar1;
}

Assistant:

SecretMatch CatalogSetSecretStorage::LookupSecret(const string &path, const string &type,
                                                  optional_ptr<CatalogTransaction> transaction) {
	auto best_match = SecretMatch();

	const std::function<void(CatalogEntry &)> callback = [&](CatalogEntry &entry) {
		auto &cast_entry = entry.Cast<SecretCatalogEntry>();
		if (StringUtil::CIEquals(cast_entry.secret->secret->GetType(), type)) {
			best_match = SelectBestMatch(*cast_entry.secret, path, tie_break_offset, best_match);
		}
	};
	secrets->Scan(GetTransactionOrDefault(transaction), callback);

	if (best_match.HasMatch()) {
		return best_match;
	}

	return SecretMatch();
}